

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError PaAlsaStreamComponent_BeginPolling(PaAlsaStreamComponent *self,pollfd *pfds)

{
  pollfd *in_RSI;
  long in_RDI;
  int ret;
  PaError result;
  
  (*alsa_snd_pcm_poll_descriptors)(*(snd_pcm_t **)(in_RDI + 0x38),in_RSI,*(uint *)(in_RDI + 0x54));
  *(undefined4 *)(in_RDI + 0x58) = 0;
  return 0;
}

Assistant:

static PaError PaAlsaStreamComponent_BeginPolling( PaAlsaStreamComponent* self, struct pollfd* pfds )
{
    PaError result = paNoError;
    int ret = alsa_snd_pcm_poll_descriptors( self->pcm, pfds, self->nfds );
    (void)ret;  /* Prevent unused variable warning if asserts are turned off */
    assert( ret == self->nfds );

    self->ready = 0;

    return result;
}